

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpServer::removeConnection(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  KcpTcpEventLoop *this_00;
  KcpWithTcpServer *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_38;
  TcpConnectionPtr *local_18;
  TcpConnectionPtr *conn_local;
  KcpWithTcpServer *this_local;
  
  this_00 = this->m_loop;
  local_70 = removeConnectionInLoop;
  local_68 = 0;
  local_78 = this;
  local_18 = conn;
  conn_local = (TcpConnectionPtr *)this;
  std::
  bind<void(sznet::net::KcpWithTcpServer::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>const&>
            (&local_60,(offset_in_KcpWithTcpServer_to_subr *)&local_70,&local_78,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void()> *)&local_38,&local_60);
  EventLoop::runInLoop(&this_00->super_EventLoop,&local_38);
  std::function<void_()>::~function(&local_38);
  std::
  _Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  ::~_Bind(&local_60);
  return;
}

Assistant:

void KcpWithTcpServer::removeConnection(const TcpConnectionPtr& conn)
{
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&KcpWithTcpServer::removeConnectionInLoop, this, conn));
}